

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall TPZMatrix<double>::Input(TPZMatrix<double> *this,istream *in)

{
  long lVar1;
  int64_t iVar2;
  void *in_RSI;
  TPZBaseMatrix *in_RDI;
  double elem;
  int64_t j;
  int64_t i;
  int64_t newCol;
  int64_t newRow;
  double local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  void *local_10;
  
  local_10 = in_RSI;
  std::istream::operator>>(in_RSI,&local_18);
  std::istream::operator>>(local_10,&local_20);
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xe])(in_RDI,local_18,local_20);
  local_28 = 0;
  while( true ) {
    lVar1 = local_28;
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar2 <= lVar1) break;
    local_30 = 0;
    while( true ) {
      lVar1 = local_30;
      iVar2 = TPZBaseMatrix::Cols(in_RDI);
      if (iVar2 <= lVar1) break;
      std::istream::operator>>(local_10,&local_38);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x20])(in_RDI,local_28,local_30,&local_38);
      local_30 = local_30 + 1;
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Input(std::istream& in )
{
  if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                std::is_same<TVar, Fad<float>>::value ||
                std::is_same<TVar, Fad<double>>::value ||
                std::is_same<TVar, Fad<long double>>::value ||
                std::is_same<TVar, TPZFlopCounter>::value) {
    PZError << __PRETTY_FUNCTION__;
    PZError << " not implemented for this type\n";
    PZError << "Aborting...";
    DebugStop();
  }
    int64_t newRow, newCol;
	in >> newRow;
	in >> newCol;
	Redim( newRow, newCol );
	int64_t i,j;
	TVar elem;
	for(i=0;i<Rows();i++)
		for(j=0;j<Cols();j++)
		{
			in >> elem;
			Put( i,j, elem );
		}
}